

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O3

void printBlock(char *banner,Integer type,void *ptr,Integer *lo,Integer *hi,Integer *ld)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  uVar2 = pnga_nodeid();
  printf("p[%d] %s lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",uVar2 & 0xffffffff,banner,
         (ulong)(uint)*lo,(ulong)(uint)*hi,(ulong)*(uint *)(lo + 1),(int)hi[1]);
  printf("    ");
  uVar2 = *lo;
  if ((long)uVar2 <= *hi) {
    do {
      printf(" %12d",uVar2 & 0xffffffff);
      bVar1 = (long)uVar2 < *hi;
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  putchar(10);
  if (lo[1] <= hi[1]) {
    uVar2 = lo[1];
    do {
      printf("J: %d",uVar2 & 0xffffffff);
      lVar4 = *lo;
      if (*lo <= *hi) {
        do {
          if (4 < type - 0x3ebU) {
switchD_00129c98_caseD_3ed:
            pnga_error("ga_matmul_basic: wrong data type",type);
            goto LAB_00129d10;
          }
          lVar3 = ((uVar2 - lo[1]) * *ld - *lo) + lVar4;
          switch(type) {
          case 0x3eb:
            dVar5 = (double)*(float *)((long)ptr + lVar3 * 4);
            break;
          case 0x3ec:
            dVar5 = *(double *)((long)ptr + lVar3 * 8);
            break;
          case 0x3ed:
            goto switchD_00129c98_caseD_3ed;
          case 0x3ee:
            dVar5 = (double)*(float *)((long)ptr + lVar3 * 8);
            dVar6 = (double)*(float *)((long)ptr + lVar3 * 8 + 4);
            goto LAB_00129cef;
          case 0x3ef:
            dVar5 = *(double *)((long)ptr + lVar3 * 0x10);
            dVar6 = *(double *)((long)ptr + lVar3 * 0x10 + 8);
LAB_00129cef:
            printf(" [%12.4f:%12.4f]",dVar5,dVar6);
            goto LAB_00129d10;
          }
          printf(" %12.4f",dVar5);
LAB_00129d10:
          bVar1 = lVar4 < *hi;
          lVar4 = lVar4 + 1;
        } while (bVar1);
      }
      putchar(10);
      bVar1 = (long)uVar2 < hi[1];
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  puts("\n");
  return;
}

Assistant:

void printBlock(char * banner, Integer type, void *ptr, Integer lo[],
    Integer hi[], Integer ld[])
{
  Integer i,j;
  Integer offset;
  printf("p[%d] %s lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",
      (int)pnga_nodeid(),banner,(int)lo[0],(int)hi[0],(int)lo[1],(int)hi[1]);
  printf("    ");
  for (i=lo[0]; i<=hi[0]; i++) printf(" %12d",(int)i);
  printf("\n");
  for (j=lo[1]; j<=hi[1]; j++) {
    printf("J: %d",(int)j);
    for (i=lo[0]; i<=hi[0]; i++) {
      offset = (j-lo[1])*ld[0] + i-lo[0];
      switch (type) {
        case C_FLOAT:
          printf(" %12.4f",*((float*)ptr+offset));
          break;
        case C_DBL:
          printf(" %12.4f",*((double*)ptr+offset));
          break;
        case C_DCPL:
          printf(" [%12.4f:%12.4f]",*((double*)ptr+2*offset),
              *((double*)ptr+2*offset+1));
          break;
        case C_SCPL:
          printf(" [%12.4f:%12.4f]",*((float*)ptr+2*offset),
              *((float*)ptr+2*offset+1));
          break;
        default:
          pnga_error("ga_matmul_basic: wrong data type", type);
      }
    }
    printf("\n");
  }
  printf("\n\n");
}